

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gradient.c
# Opt level: O2

void grd_spdopsi(grd_st_t *grd_st,seq_t *seq)

{
  uint uVar1;
  mdl_t *pmVar2;
  double *r;
  double *pdVar3;
  double *r_00;
  uint32_t *puVar4;
  uint32_t *puVar5;
  uint32_t *puVar6;
  uint32_t t;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint32_t y_1;
  ulong uVar10;
  ulong uVar11;
  uint32_t nnz;
  uint32_t uVar12;
  uint32_t y;
  ulong uVar13;
  uint64_t N;
  double dVar14;
  
  pmVar2 = grd_st->mdl;
  r = grd_st->psi;
  pdVar3 = pmVar2->theta;
  uVar1 = pmVar2->nlbl;
  uVar10 = (ulong)uVar1;
  uVar8 = (ulong)seq->len;
  r_00 = grd_st->psiuni;
  puVar4 = grd_st->psiyp;
  puVar5 = grd_st->psiidx;
  puVar6 = grd_st->psioff;
  for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
    for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
      dVar14 = 0.0;
      for (uVar11 = 0; *(uint *)&seq[uVar7 * 2 + 1].field_0x4 != uVar11; uVar11 = uVar11 + 1) {
        dVar14 = dVar14 + pdVar3[uVar13 + pmVar2->uoff
                                          [*(long *)(*(long *)(seq + uVar7 * 2 + 2) + uVar11 * 8)]];
      }
      r_00[uVar7 * uVar10 + uVar13] = dVar14;
    }
  }
  N = 0;
  for (uVar7 = 1; uVar7 < uVar8; uVar7 = uVar7 + 1) {
    puVar6[uVar7] = (uint32_t)N;
    uVar12 = 0;
    for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
      for (uVar11 = 0; uVar11 != uVar10; uVar11 = uVar11 + 1) {
        dVar14 = 0.0;
        for (uVar9 = 0; *(uint *)&seq[uVar7 * 2 + 1].raw != uVar9; uVar9 = uVar9 + 1) {
          dVar14 = dVar14 + pdVar3[uVar13 + (ulong)(uVar1 * (uint32_t)uVar11) +
                                            pmVar2->boff[seq[uVar7 * 2 + 2].raw[uVar9]]];
        }
        if ((dVar14 != 0.0) || (NAN(dVar14))) {
          puVar4[N] = (uint32_t)uVar11;
          r[N] = dVar14;
          uVar12 = uVar12 + 1;
          N = (uint64_t)((int)N + 1);
        }
      }
      puVar5[uVar7 * uVar10 + uVar13] = uVar12;
    }
  }
  xvm_expma(r_00,r_00,0.0,uVar8 * uVar10);
  xvm_expma(r,r,1.0,N);
  return;
}

Assistant:

void grd_spdopsi(grd_st_t *grd_st, const seq_t *seq) {
	const mdl_t *mdl = grd_st->mdl;
	const double  *x = mdl->theta;
	const uint32_t Y = mdl->nlbl;
	const uint32_t T = seq->len;
	double   (*psiuni)[T][Y] = (void *)grd_st->psiuni;
	double    *psival        =         grd_st->psi;
	uint32_t  *psiyp         =         grd_st->psiyp;
	uint32_t (*psiidx)[T][Y] = (void *)grd_st->psiidx;
	uint32_t  *psioff        =         grd_st->psioff;
	for (uint32_t t = 0; t < T; t++) {
		const pos_t *pos = &(seq->pos[t]);
		for (uint32_t y = 0; y < Y; y++) {
			double sum = 0.0;
			for (uint32_t n = 0; n < pos->ucnt; n++) {
				const uint64_t o = pos->uobs[n];
				sum += x[mdl->uoff[o] + y];
			}
			(*psiuni)[t][y] = sum;
		}
	}
	uint32_t off = 0;
	for (uint32_t t = 1; t < T; t++) {
		const pos_t *pos = &(seq->pos[t]);
		psioff[t] = off;
		for (uint32_t y = 0, nnz = 0; y < Y; y++) {
			for (uint32_t yp = 0; yp < Y; yp++) {
				double sum = 0.0;
				for (uint32_t n = 0; n < pos->bcnt; n++) {
					const uint64_t o = pos->bobs[n];
					sum += x[mdl->boff[o] + yp * Y + y];
				}
				if (sum == 0.0)
					continue;
				psiyp [off] = yp;
				psival[off] = sum;
				nnz++, off++;
			}
			(*psiidx)[t][y] = nnz;
		}
	}
	xvm_expma((double *)psiuni, (double *)psiuni, 0.0, (uint64_t)T * Y);
	xvm_expma((double *)psival, (double *)psival, 1.0, off);
}